

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-gui.cpp
# Opt level: O1

int Gui::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  ImGuiStyle *pIVar4;
  ulong uVar5;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  EVP_PKEY_CTX *ctx_00;
  SDL_DisplayMode current;
  undefined1 local_40 [24];
  uint7 extraout_var;
  
  SDL_GL_SetAttribute(0x14,0);
  SDL_GL_SetAttribute(0x15,1);
  SDL_GL_SetAttribute(0x11,3);
  SDL_GL_SetAttribute(0x12,0);
  SDL_GL_SetAttribute(5,1);
  SDL_GL_SetAttribute(6,0x18);
  SDL_GL_SetAttribute(7,8);
  SDL_GetCurrentDisplayMode(0,local_40);
  uVar3 = SDL_CreateWindow(ctx,0x2fff0000,0x2fff0000,in_ESI,in_EDX,0x2022);
  *in_RCX = uVar3;
  uVar3 = SDL_GL_CreateContext(uVar3);
  in_RCX[1] = uVar3;
  SDL_GL_MakeCurrent(*in_RCX,uVar3);
  ctx_00 = (EVP_PKEY_CTX *)0x1;
  SDL_GL_SetSwapInterval();
  iVar1 = gl3wInit();
  if (iVar1 == 0) {
    ImGui::DebugCheckVersionAndDataLayout("1.77 WIP",0x1560,0x3b8,8,0x10,0x14,4);
    ImGui::CreateContext((ImFontAtlas *)0x0);
    ImGui::GetIO();
    pIVar4 = ImGui::GetStyle();
    pIVar4->AntiAliasedLines = false;
    pIVar4->AntiAliasedFill = false;
    pIVar4->WindowRounding = 0.0;
    (pIVar4->WindowPadding).x = 8.0;
    (pIVar4->WindowPadding).y = 8.0;
    (pIVar4->FramePadding).x = 4.0;
    (pIVar4->FramePadding).y = 3.0;
    pIVar4->FrameRounding = 0.0;
    (pIVar4->ItemSpacing).x = 8.0;
    (pIVar4->ItemSpacing).y = 4.0;
    (pIVar4->ItemInnerSpacing).x = 4.0;
    (pIVar4->ItemInnerSpacing).y = 4.0;
    pIVar4->IndentSpacing = 21.0;
    pIVar4->ScrollbarSize = 16.0;
    pIVar4->ScrollbarRounding = 9.0;
    pIVar4->GrabMinSize = 10.0;
    pIVar4->GrabRounding = 3.0;
    pIVar4->Colors[0].x = 1.0;
    pIVar4->Colors[0].y = 1.0;
    pIVar4->Colors[0].z = 1.0;
    pIVar4->Colors[0].w = 1.0;
    pIVar4->Colors[1].x = 0.24;
    pIVar4->Colors[1].y = 0.41;
    pIVar4->Colors[1].z = 0.41;
    pIVar4->Colors[1].w = 1.0;
    pIVar4->Colors[2].x = 0.08;
    pIVar4->Colors[2].y = 0.08;
    pIVar4->Colors[2].z = 0.08;
    pIVar4->Colors[2].w = 0.94;
    pIVar4->Colors[4].x = 0.07;
    pIVar4->Colors[4].y = 0.07;
    pIVar4->Colors[4].z = 0.09;
    pIVar4->Colors[4].w = 1.0;
    pIVar4->Colors[5].x = 0.31;
    pIVar4->Colors[5].y = 0.31;
    pIVar4->Colors[5].z = 0.31;
    pIVar4->Colors[5].w = 0.71;
    pIVar4->Colors[6].x = 0.0;
    pIVar4->Colors[6].y = 0.0;
    pIVar4->Colors[6].z = 0.0;
    pIVar4->Colors[6].w = 0.0;
    pIVar4->Colors[7].x = 0.0;
    pIVar4->Colors[7].y = 0.39;
    pIVar4->Colors[7].z = 0.39;
    *(undefined8 *)&pIVar4->Colors[7].w = 0x3e851eb83ec7ae14;
    pIVar4->Colors[8].y = 1.0;
    pIVar4->Colors[8].z = 1.0;
    *(undefined8 *)&pIVar4->Colors[8].w = 0x3ec7ae14;
    pIVar4->Colors[9].y = 0.78;
    pIVar4->Colors[9].z = 0.0;
    *(undefined8 *)&pIVar4->Colors[9].w = 0x3f800000;
    pIVar4->Colors[10].y = 0.5;
    pIVar4->Colors[10].z = 0.5;
    *(undefined8 *)&pIVar4->Colors[10].w = 0x3f333333;
    *(undefined8 *)&pIVar4->Colors[0xb].y = 0x3f3333333f333333;
    *(undefined8 *)&pIVar4->Colors[0xb].w = 0x3f800000;
    pIVar4->Colors[0xc].y = 0.5;
    pIVar4->Colors[0xc].z = 0.5;
    *(undefined8 *)&pIVar4->Colors[0xc].w = 0x3f800000;
    *(undefined8 *)&pIVar4->Colors[0xd].y = 0x3f3333333f333333;
    *(undefined8 *)&pIVar4->Colors[0xd].w = 0x3dcccccd3f800000;
    pIVar4->Colors[0xe].y = 0.27;
    pIVar4->Colors[0xe].z = 0.27;
    *(undefined8 *)&pIVar4->Colors[0xe].w = 0x3f4ccccd3f800000;
    pIVar4->Colors[0xf].y = 0.8;
    pIVar4->Colors[0xf].z = 0.83;
    *(undefined8 *)&pIVar4->Colors[0xf].w = 0x3e851eb83e9eb852;
    pIVar4->Colors[0x10].y = 1.0;
    pIVar4->Colors[0x10].z = 1.0;
    *(undefined8 *)&pIVar4->Colors[0x10].w = 0x3ec7ae14;
    pIVar4->Colors[0x11].y = 0.78;
    pIVar4->Colors[0x11].z = 0.0;
    *(undefined8 *)&pIVar4->Colors[0x11].w = 0x3f4ccccd3f800000;
    pIVar4->Colors[0x12].y = 0.8;
    pIVar4->Colors[0x12].z = 0.83;
    *(undefined8 *)&pIVar4->Colors[0x12].w = 0x3f4ccccd3ec7ae14;
    pIVar4->Colors[0x13].y = 0.8;
    pIVar4->Colors[0x13].z = 0.83;
    *(undefined8 *)&pIVar4->Colors[0x13].w = 0x3ec7ae14;
    pIVar4->Colors[0x14].y = 0.78;
    pIVar4->Colors[0x14].z = 0.0;
    *(undefined8 *)&pIVar4->Colors[0x14].w = 0x3e051eb83f800000;
    pIVar4->Colors[0x15].y = 0.55;
    pIVar4->Colors[0x15].z = 0.55;
    *(undefined8 *)&pIVar4->Colors[0x15].w = 0x3f1c28f63f800000;
    pIVar4->Colors[0x16].y = 1.0;
    pIVar4->Colors[0x16].z = 0.0;
    *(undefined8 *)&pIVar4->Colors[0x16].w = 0x3f028f5c;
    pIVar4->Colors[0x17].y = 0.78;
    pIVar4->Colors[0x17].z = 0.0;
    *(undefined8 *)&pIVar4->Colors[0x17].w = 0x3f4a3d713f800000;
    pIVar4->Colors[0x18].y = 0.51;
    pIVar4->Colors[0x18].z = 0.0;
    *(undefined8 *)&pIVar4->Colors[0x18].w = 0x3f4a3d713f028f5c;
    pIVar4->Colors[0x19].y = 0.51;
    pIVar4->Colors[0x19].z = 0.0;
    *(undefined8 *)&pIVar4->Colors[0x19].w = 0x3f4a3d713f2b851f;
    pIVar4->Colors[0x1a].y = 0.51;
    pIVar4->Colors[0x1a].z = 0.0;
    pIVar4->Colors[0x1a].w = 0.67;
    pIVar4->Colors[0x1e].x = 0.0;
    pIVar4->Colors[0x1e].y = 0.0;
    pIVar4->Colors[0x1e].z = 0.0;
    pIVar4->Colors[0x1e].w = 0.0;
    pIVar4->Colors[0x1f].x = 0.26;
    pIVar4->Colors[0x1f].y = 1.0;
    pIVar4->Colors[0x1f].z = 1.0;
    pIVar4->Colors[0x1f].w = 0.39;
    pIVar4->Colors[0x20].x = 0.0;
    pIVar4->Colors[0x20].y = 0.78;
    pIVar4->Colors[0x20].z = 0.0;
    pIVar4->Colors[0x20].w = 1.0;
    pIVar4->Colors[0x26].x = 1.0;
    pIVar4->Colors[0x26].y = 0.65;
    pIVar4->Colors[0x26].z = 0.38;
    pIVar4->Colors[0x26].w = 0.67;
    pIVar4->Colors[0x27].x = 0.25;
    pIVar4->Colors[0x27].y = 1.0;
    pIVar4->Colors[0x27].z = 0.0;
    pIVar4->Colors[0x27].w = 1.0;
    pIVar4->Colors[0x28].x = 1.0;
    pIVar4->Colors[0x28].y = 0.65;
    pIVar4->Colors[0x28].z = 0.38;
    pIVar4->Colors[0x28].w = 0.67;
    pIVar4->Colors[0x29].x = 0.25;
    pIVar4->Colors[0x29].y = 1.0;
    pIVar4->Colors[0x29].z = 0.0;
    pIVar4->Colors[0x29].w = 1.0;
    pIVar4->Colors[0x2a].x = 0.25;
    pIVar4->Colors[0x2a].y = 1.0;
    pIVar4->Colors[0x2a].z = 0.0;
    pIVar4->Colors[0x2a].w = 0.43;
    pIVar4->Colors[0x2f].x = 1.0;
    pIVar4->Colors[0x2f].y = 0.98;
    pIVar4->Colors[0x2f].z = 0.95;
    pIVar4->Colors[0x2f].w = 0.78;
    ImGui_ImplSDL2_InitForOpenGL((SDL_Window *)*in_RCX,(void *)in_RCX[1]);
    ImGui_ImplOpenGL3_Init("#version 130");
    uVar5 = (ulong)extraout_var << 8;
  }
  else {
    uVar2 = init(ctx_00);
    uVar5 = (ulong)uVar2;
  }
  return (int)CONCAT71((int7)(uVar5 >> 8),iVar1 == 0);
}

Assistant:

bool init(const char * windowTitle, int windowSizeX, int windowSizeY, Objects & objects) {
#if __APPLE__
    // GL 3.2 Core + GLSL 150
    const char* glsl_version = "#version 150";
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_FLAGS, SDL_GL_CONTEXT_FORWARD_COMPATIBLE_FLAG);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_CORE);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 3);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 2);
#elif __EMSCRIPTEN__
    const char* glsl_version = "#version 100";
    //const char* glsl_version = "#version 300 es";
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_FLAGS, 0);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_ES);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 2);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 0);
#else
    // GL 3.0 + GLSL 130
    const char* glsl_version = "#version 130";
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_FLAGS, 0);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_CORE);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 3);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 0);
#endif

    // Create window with graphics context
    SDL_GL_SetAttribute(SDL_GL_DOUBLEBUFFER, 1);
    SDL_GL_SetAttribute(SDL_GL_DEPTH_SIZE, 24);
    SDL_GL_SetAttribute(SDL_GL_STENCIL_SIZE, 8);
    SDL_DisplayMode current;
    SDL_GetCurrentDisplayMode(0, &current);

#ifdef __EMSCRIPTEN__
    SDL_Renderer *renderer;
    SDL_CreateWindowAndRenderer(windowSizeX, windowSizeY, SDL_WINDOW_OPENGL, &objects.window, &renderer);
#else
    objects.window = SDL_CreateWindow(windowTitle, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, windowSizeX, windowSizeY, SDL_WINDOW_OPENGL|SDL_WINDOW_RESIZABLE|SDL_WINDOW_ALLOW_HIGHDPI);
#endif

    objects.gl_context = SDL_GL_CreateContext(objects.window);
    SDL_GL_MakeCurrent(objects.window, objects.gl_context);
    SDL_GL_SetSwapInterval(1); // Enable vsync

    // Initialize OpenGL loader
#if defined(IMGUI_IMPL_OPENGL_LOADER_GL3W)
    bool err = gl3wInit() != 0;
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLEW)
    bool err = glewInit() != GLEW_OK;
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLAD)
    bool err = gladLoadGL() == 0;
#else
    bool err = false; // If you use IMGUI_IMPL_OPENGL_LOADER_CUSTOM, your loader is likely to requires some form of initialization.
#endif
    if (err) {
        fprintf(stderr, "Failed to initialize OpenGL loader!\n");
        return false;
    }

    // Setup Dear ImGui binding
    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableKeyboard;  // Enable Keyboard Controls

    ImGuiStyle & style = ImGui::GetStyle();

    style.AntiAliasedFill = false;
    style.AntiAliasedLines = false;
    style.WindowRounding = 0.0f;

    style.WindowPadding = ImVec2(8, 8);
    style.WindowRounding = 0.0f;
    style.FramePadding = ImVec2(4, 3);
    style.FrameRounding = 0.0f;
    style.ItemSpacing = ImVec2(8, 4);
    style.ItemInnerSpacing = ImVec2(4, 4);
    style.IndentSpacing = 21.0f;
    style.ScrollbarSize = 16.0f;
    style.ScrollbarRounding = 9.0f;
    style.GrabMinSize = 10.0f;
    style.GrabRounding = 3.0f;

    style.Colors[ImGuiCol_Text]                  = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    style.Colors[ImGuiCol_TextDisabled]          = ImVec4(0.24f, 0.41f, 0.41f, 1.00f);
    style.Colors[ImGuiCol_WindowBg]              = ImVec4(0.08f, 0.08f, 0.08f, 0.94f);
    //style.Colors[ImGuiCol_ChildWindowBg]         = ImVec4(0.07f, 0.07f, 0.09f, 1.00f);
    style.Colors[ImGuiCol_PopupBg]               = ImVec4(0.07f, 0.07f, 0.09f, 1.00f);
    style.Colors[ImGuiCol_Border]                = ImVec4(0.31f, 0.31f, 0.31f, 0.71f);
    style.Colors[ImGuiCol_BorderShadow]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_FrameBg]               = ImVec4(0.00f, 0.39f, 0.39f, 0.39f);
    style.Colors[ImGuiCol_FrameBgHovered]        = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_FrameBgActive]         = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_TitleBg]               = ImVec4(0.00f, 0.50f, 0.50f, 0.70f);
    style.Colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(0.00f, 0.50f, 0.50f, 1.00f);
    style.Colors[ImGuiCol_TitleBgActive]         = ImVec4(0.00f, 0.70f, 0.70f, 1.00f);
    style.Colors[ImGuiCol_MenuBarBg]             = ImVec4(0.00f, 0.70f, 0.70f, 1.00f);
    style.Colors[ImGuiCol_ScrollbarBg]           = ImVec4(0.10f, 0.27f, 0.27f, 1.00f);
    style.Colors[ImGuiCol_ScrollbarGrab]         = ImVec4(0.80f, 0.80f, 0.83f, 0.31f);
    style.Colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_ComboBg]               = ImVec4(0.00f, 0.39f, 0.39f, 1.00f);
    style.Colors[ImGuiCol_CheckMark]             = ImVec4(0.80f, 0.80f, 0.83f, 0.39f);
    style.Colors[ImGuiCol_SliderGrab]            = ImVec4(0.80f, 0.80f, 0.83f, 0.39f);
    style.Colors[ImGuiCol_SliderGrabActive]      = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_Button]                = ImVec4(0.13f, 0.55f, 0.55f, 1.00f);
    style.Colors[ImGuiCol_ButtonHovered]         = ImVec4(0.61f, 1.00f, 0.00f, 0.51f);
    style.Colors[ImGuiCol_ButtonActive]          = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_Header]                = ImVec4(0.79f, 0.51f, 0.00f, 0.51f);
    style.Colors[ImGuiCol_HeaderHovered]         = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_HeaderActive]          = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    //style.Colors[ImGuiCol_Column]                = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    //style.Colors[ImGuiCol_ColumnHovered]         = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_ColumnActive]          = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_ResizeGrip]            = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_ResizeGripHovered]     = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_ResizeGripActive]      = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_CloseButton]           = ImVec4(0.40f, 0.39f, 0.38f, 0.16f);
    //style.Colors[ImGuiCol_CloseButtonHovered]    = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    //style.Colors[ImGuiCol_CloseButtonActive]     = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_PlotLines]             = ImVec4(1.00f, 0.65f, 0.38f, 0.67f);
    style.Colors[ImGuiCol_PlotLinesHovered]      = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_PlotHistogram]         = ImVec4(1.00f, 0.65f, 0.38f, 0.67f);
    style.Colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_TextSelectedBg]        = ImVec4(0.25f, 1.00f, 0.00f, 0.43f);
    style.Colors[ImGuiCol_ModalWindowDarkening]  = ImVec4(1.00f, 0.98f, 0.95f, 0.78f);

    ImGui_ImplSDL2_InitForOpenGL(objects.window, objects.gl_context);
    ImGui_ImplOpenGL3_Init(glsl_version);

    return true;
}